

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

string * __thiscall
wabt::(anonymous_namespace)::CWriter::MangleName_abi_cxx11_
          (string *__return_storage_ptr__,CWriter *this,string_view name)

{
  bool bVar1;
  int iVar2;
  string local_68;
  byte local_41;
  const_iterator pcStack_40;
  char c;
  const_iterator __end3;
  const_iterator __begin3;
  string_view *__range3;
  undefined1 auStack_20 [7];
  char kPrefix;
  string_view name_local;
  string *result;
  
  name_local.data_ = name.data_;
  __range3._7_1_ = 0x5a;
  __range3._6_1_ = 0;
  _auStack_20 = this;
  name_local.size_ = (size_type)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,"Z_",(allocator *)((long)&__range3 + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 5));
  bVar1 = string_view::empty((string_view *)auStack_20);
  if (!bVar1) {
    __begin3 = auStack_20;
    __end3 = string_view::begin((string_view *)__begin3);
    pcStack_40 = string_view::end((string_view *)__begin3);
    for (; __end3 != pcStack_40; __end3 = __end3 + 1) {
      local_41 = *__end3;
      iVar2 = isalnum((int)(char)local_41);
      if (((iVar2 == 0) || (local_41 == 0x5a)) && (local_41 != 0x5f)) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'Z');
        StringPrintf_abi_cxx11_(&local_68,"%02X",(ulong)local_41);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_68);
        std::__cxx11::string::~string((string *)&local_68);
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_41);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CWriter::MangleName(string_view name) {
  const char kPrefix = 'Z';
  std::string result = "Z_";

  if (!name.empty()) {
    for (char c : name) {
      if ((isalnum(c) && c != kPrefix) || c == '_') {
        result += c;
      } else {
        result += kPrefix;
        result += StringPrintf("%02X", static_cast<uint8_t>(c));
      }
    }
  }

  return result;
}